

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_asm_impl.h
# Opt level: O0

void secp256k1_fe_sqr_inner(uint64_t *r,uint64_t *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uint64_t *a_local;
  uint64_t *r_local;
  
  uVar51 = *a;
  uVar53 = a[1];
  uVar1 = a[2];
  uVar2 = a[3];
  uVar3 = a[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar51 * 2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar53 * 2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar3;
  uVar48 = SUB168(auVar6 * auVar26,0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar48 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar25 + auVar4 * auVar24 + auVar7 * ZEXT816(0x1000003d10);
  uVar49 = auVar4._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar49 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar3 = uVar3 * 2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar51;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar53 * 2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar48 >> 0x34 | SUB168(auVar6 * auVar26,8) << 0xc;
  auVar4 = auVar8 * auVar27 + auVar40 + auVar9 * auVar28 + auVar10 * auVar29 +
           auVar11 * ZEXT816(0x1000003d10);
  uVar48 = auVar4._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar48 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar51;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar51;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar53;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1 * 2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar2;
  auVar4 = auVar13 * auVar31 + auVar42 + auVar14 * auVar32;
  uVar50 = auVar4._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar50 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (uVar50 & 0xfffffffffffff) << 4 | (uVar48 & 0xfffffffffffff) >> 0x30;
  uVar50 = auVar41._0_8_;
  auVar41 = auVar12 * auVar30 + ZEXT816(0x1000003d1) * auVar33;
  *r = uVar50 & 0xfffffffffffff;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar50 >> 0x34 | auVar41._8_8_ << 0xc;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar51 * 2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar53;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar2;
  auVar5 = auVar16 * auVar35 + auVar44 + auVar17 * auVar36;
  uVar50 = auVar5._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar50 & 0xfffffffffffff;
  auVar4 = auVar15 * auVar34 + auVar43 + auVar18 * ZEXT816(0x1000003d10);
  uVar52 = auVar4._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar50 >> 0x34 | auVar5._8_8_ << 0xc;
  r[1] = uVar52 & 0xfffffffffffff;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar52 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar51 * 2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar53;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar53;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar3;
  auVar46 = auVar21 * auVar39 + auVar46;
  uVar51 = auVar46._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar51 & 0xfffffffffffff;
  auVar4 = auVar19 * auVar37 + auVar45 + auVar20 * auVar38 + auVar22 * ZEXT816(0x1000003d10);
  uVar53 = auVar4._0_8_;
  r[2] = uVar53 & 0xfffffffffffff;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = (uVar53 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar49 & 0xfffffffffffff);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar51 >> 0x34 | auVar46._8_8_ << 0xc;
  auVar47 = auVar23 * ZEXT816(0x1000003d10) + auVar47;
  uVar51 = auVar47._0_8_;
  r[3] = uVar51 & 0xfffffffffffff;
  r[4] = (uVar51 >> 0x34 | auVar47._8_8_ << 0xc) + (uVar48 & 0xffffffffffff);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr_inner(uint64_t *r, const uint64_t *a) {
/**
 * Registers: rdx:rax = multiplication accumulator
 *            r9:r8   = c
 *            rcx:rbx = d
 *            r10-r14 = a0-a4
 *            r15     = M (0xfffffffffffff)
 *            rdi     = r
 *            rsi     = a / t?
 */
  uint64_t tmp1, tmp2, tmp3;
__asm__ __volatile__(
    "movq 0(%%rsi),%%r10\n"
    "movq 8(%%rsi),%%r11\n"
    "movq 16(%%rsi),%%r12\n"
    "movq 24(%%rsi),%%r13\n"
    "movq 32(%%rsi),%%r14\n"
    "movq $0xfffffffffffff,%%r15\n"

    /* d = (a0*2) * a3 */
    "leaq (%%r10,%%r10,1),%%rax\n"
    "mulq %%r13\n"
    "movq %%rax,%%rbx\n"
    "movq %%rdx,%%rcx\n"
    /* d += (a1*2) * a2 */
    "leaq (%%r11,%%r11,1),%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* c = a4 * a4 */
    "movq %%r14,%%rax\n"
    "mulq %%r14\n"
    "movq %%rax,%%r8\n"
    "movq %%rdx,%%r9\n"
    /* d += (c & M) * R */
    "andq %%r15,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* c >>= 52 (%%r8 only) */
    "shrdq $52,%%r9,%%r8\n"
    /* t3 (tmp1) = d & M */
    "movq %%rbx,%%rsi\n"
    "andq %%r15,%%rsi\n"
    "movq %%rsi,%q1\n"
    /* d >>= 52 */
    "shrdq $52,%%rcx,%%rbx\n"
    "xorq %%rcx,%%rcx\n"
    /* a4 *= 2 */
    "addq %%r14,%%r14\n"
    /* d += a0 * a4 */
    "movq %%r10,%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* d+= (a1*2) * a3 */
    "leaq (%%r11,%%r11,1),%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* d += a2 * a2 */
    "movq %%r12,%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* d += c * R */
    "movq %%r8,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* t4 = d & M (%%rsi) */
    "movq %%rbx,%%rsi\n"
    "andq %%r15,%%rsi\n"
    /* d >>= 52 */
    "shrdq $52,%%rcx,%%rbx\n"
    "xorq %%rcx,%%rcx\n"
    /* tx = t4 >> 48 (tmp3) */
    "movq %%rsi,%%rax\n"
    "shrq $48,%%rax\n"
    "movq %%rax,%q3\n"
    /* t4 &= (M >> 4) (tmp2) */
    "movq $0xffffffffffff,%%rax\n"
    "andq %%rax,%%rsi\n"
    "movq %%rsi,%q2\n"
    /* c = a0 * a0 */
    "movq %%r10,%%rax\n"
    "mulq %%r10\n"
    "movq %%rax,%%r8\n"
    "movq %%rdx,%%r9\n"
    /* d += a1 * a4 */
    "movq %%r11,%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* d += (a2*2) * a3 */
    "leaq (%%r12,%%r12,1),%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* u0 = d & M (%%rsi) */
    "movq %%rbx,%%rsi\n"
    "andq %%r15,%%rsi\n"
    /* d >>= 52 */
    "shrdq $52,%%rcx,%%rbx\n"
    "xorq %%rcx,%%rcx\n"
    /* u0 = (u0 << 4) | tx (%%rsi) */
    "shlq $4,%%rsi\n"
    "movq %q3,%%rax\n"
    "orq %%rax,%%rsi\n"
    /* c += u0 * (R >> 4) */
    "movq $0x1000003d1,%%rax\n"
    "mulq %%rsi\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* r[0] = c & M */
    "movq %%r8,%%rax\n"
    "andq %%r15,%%rax\n"
    "movq %%rax,0(%%rdi)\n"
    /* c >>= 52 */
    "shrdq $52,%%r9,%%r8\n"
    "xorq %%r9,%%r9\n"
    /* a0 *= 2 */
    "addq %%r10,%%r10\n"
    /* c += a0 * a1 */
    "movq %%r10,%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d += a2 * a4 */
    "movq %%r12,%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* d += a3 * a3 */
    "movq %%r13,%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* c += (d & M) * R */
    "movq %%rbx,%%rax\n"
    "andq %%r15,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d >>= 52 */
    "shrdq $52,%%rcx,%%rbx\n"
    "xorq %%rcx,%%rcx\n"
    /* r[1] = c & M */
    "movq %%r8,%%rax\n"
    "andq %%r15,%%rax\n"
    "movq %%rax,8(%%rdi)\n"
    /* c >>= 52 */
    "shrdq $52,%%r9,%%r8\n"
    "xorq %%r9,%%r9\n"
    /* c += a0 * a2 (last use of %%r10) */
    "movq %%r10,%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* fetch t3 (%%r10, overwrites a0),t4 (%%rsi) */
    "movq %q2,%%rsi\n"
    "movq %q1,%%r10\n"
    /* c += a1 * a1 */
    "movq %%r11,%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d += a3 * a4 */
    "movq %%r13,%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rbx\n"
    "adcq %%rdx,%%rcx\n"
    /* c += (d & M) * R */
    "movq %%rbx,%%rax\n"
    "andq %%r15,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d >>= 52 (%%rbx only) */
    "shrdq $52,%%rcx,%%rbx\n"
    /* r[2] = c & M */
    "movq %%r8,%%rax\n"
    "andq %%r15,%%rax\n"
    "movq %%rax,16(%%rdi)\n"
    /* c >>= 52 */
    "shrdq $52,%%r9,%%r8\n"
    "xorq %%r9,%%r9\n"
    /* c += t3 */
    "addq %%r10,%%r8\n"
    /* c += d * R */
    "movq %%rbx,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* r[3] = c & M */
    "movq %%r8,%%rax\n"
    "andq %%r15,%%rax\n"
    "movq %%rax,24(%%rdi)\n"
    /* c >>= 52 (%%r8 only) */
    "shrdq $52,%%r9,%%r8\n"
    /* c += t4 (%%r8 only) */
    "addq %%rsi,%%r8\n"
    /* r[4] = c */
    "movq %%r8,32(%%rdi)\n"
: "+S"(a), "=m"(tmp1), "=m"(tmp2), "=m"(tmp3)
: "D"(r)
: "%rax", "%rbx", "%rcx", "%rdx", "%r8", "%r9", "%r10", "%r11", "%r12", "%r13", "%r14", "%r15", "cc", "memory"
);
}